

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimMv.c
# Opt level: O3

int Saig_MvSimHash(uint *pState,int nFlops,int TableSize)

{
  uint uVar1;
  ulong uVar2;
  
  if (nFlops < 1) {
    uVar1 = 0;
  }
  else {
    uVar2 = 0;
    uVar1 = 0;
    do {
      uVar1 = uVar1 ^ Saig_MvSimHash::s_SPrimes[(uint)uVar2 & 0xf] * pState[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)nFlops != uVar2);
  }
  return uVar1 % (uint)TableSize;
}

Assistant:

int Saig_MvSimHash( unsigned * pState, int nFlops, int TableSize )
{
    static int s_SPrimes[16] = { 
     1610612741,
     805306457,
     402653189,
     201326611,
     100663319,
     50331653,
     25165843,
     12582917,
     6291469,
     3145739,
     1572869,
     786433,
     393241,
     196613,
     98317,
     49157
    };
    unsigned uHash = 0;
    int i;
    for ( i = 0; i < nFlops; i++ )
        uHash ^= pState[i] * s_SPrimes[i & 0xF];
    return (int)(uHash % TableSize);
}